

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aixlog.hpp
# Opt level: O0

void __thiscall AixLog::Filter::Filter(Filter *this,Severity severity)

{
  Severity in_stack_0000003f;
  Filter *in_stack_00000040;
  
  std::
  map<AixLog::Tag,_AixLog::Severity,_std::less<AixLog::Tag>,_std::allocator<std::pair<const_AixLog::Tag,_AixLog::Severity>_>_>
  ::map((map<AixLog::Tag,_AixLog::Severity,_std::less<AixLog::Tag>,_std::allocator<std::pair<const_AixLog::Tag,_AixLog::Severity>_>_>
         *)0x1cb1de);
  add_filter(in_stack_00000040,in_stack_0000003f);
  return;
}

Assistant:

Filter(Severity severity) { add_filter(severity); }